

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O0

void LearnVocabFromTrainFile(void)

{
  int iVar1;
  FILE *__stream;
  longlong i;
  longlong a;
  FILE *fin;
  char word [100];
  
  for (i = 0; i < 30000000; i = i + 1) {
    vocab_hash[i] = -1;
  }
  __stream = fopen(train_file,"rb");
  if (__stream != (FILE *)0x0) {
    vocab_size = 0;
    AddWordToVocab("</s>");
    while( true ) {
      ReadWord((char *)&fin,(FILE *)__stream);
      iVar1 = feof(__stream);
      if (iVar1 != 0) break;
      train_words = train_words + 1;
      if ((1 < debug_mode) && (train_words % 100000 == 0)) {
        printf("%lldK%c",train_words / 1000,0xd);
        fflush(_stdout);
      }
      iVar1 = SearchVocab((char *)&fin);
      if ((long)iVar1 == -1) {
        iVar1 = AddWordToVocab((char *)&fin);
        vocab[iVar1].cn = 1;
      }
      else {
        vocab[iVar1].cn = vocab[iVar1].cn + 1;
      }
      if (21000000.0 < (double)vocab_size) {
        ReduceVocab();
      }
    }
    SortVocab();
    if (0 < debug_mode) {
      printf("Vocab size: %lld\n",vocab_size);
      printf("Words in train file: %lld\n",train_words);
    }
    file_size = ftell(__stream);
    fclose(__stream);
    return;
  }
  printf("ERROR: training data file not found!\n");
  exit(1);
}

Assistant:

void LearnVocabFromTrainFile() {
  char word[MAX_STRING];
  FILE *fin;
  long long a, i;
  for (a = 0; a < vocab_hash_size; a++) vocab_hash[a] = -1;
  fin = fopen(train_file, "rb");
  if (fin == NULL) {
    printf("ERROR: training data file not found!\n");
    exit(1);
  }
  vocab_size = 0;
  AddWordToVocab((char *)"</s>");
  while (1) {
    ReadWord(word, fin);
    if (feof(fin)) break;
    train_words++;
    if ((debug_mode > 1) && (train_words % 100000 == 0)) {
      printf("%lldK%c", train_words / 1000, 13);
      fflush(stdout);
    }
    i = SearchVocab(word);
    if (i == -1) {
      a = AddWordToVocab(word);
      vocab[a].cn = 1;
    } else vocab[i].cn++;
    if (vocab_size > vocab_hash_size * 0.7) ReduceVocab();
  }
  SortVocab();
  if (debug_mode > 0) {
    printf("Vocab size: %lld\n", vocab_size);
    printf("Words in train file: %lld\n", train_words);
  }
  file_size = ftell(fin);
  fclose(fin);
}